

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O2

void __thiscall
vkt::sr::anon_unknown_0::TriangleDerivateCaseInstance::setupDefaultInputs
          (TriangleDerivateCaseInstance *this)

{
  undefined8 uVar1;
  DerivateCaseValues *pDVar2;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  undefined4 local_74;
  float local_70;
  float local_6c;
  float local_68;
  undefined4 local_64;
  float local_60;
  float local_5c;
  float local_58;
  undefined4 uStack_54;
  float fStack_50;
  float fStack_4c;
  float positions [16];
  
  positions._48_8_ = &DAT_3f8000003f800000;
  positions[0xe] = 0.0;
  positions[0xf] = 1.0;
  positions[8] = 1.0;
  positions[9] = -1.0;
  positions[10] = 0.0;
  positions[0xb] = 1.0;
  positions[4] = -1.0;
  positions[5] = 1.0;
  positions[6] = 0.0;
  positions[7] = 1.0;
  positions[0] = -1.0;
  positions[1] = -1.0;
  positions[2] = 0.0;
  positions[3] = 1.0;
  pDVar2 = this->m_values;
  local_78 = (pDVar2->coordMin).m_data[0];
  uVar1 = *(undefined8 *)((pDVar2->coordMin).m_data + 1);
  local_88 = (pDVar2->coordMin).m_data[0];
  fStack_84 = (pDVar2->coordMin).m_data[1];
  fStack_7c = (pDVar2->coordMax).m_data[3];
  local_64 = (undefined4)uVar1;
  fStack_80 = (float)((ulong)uVar1 >> 0x20);
  uVar1 = *(undefined8 *)((pDVar2->coordMax).m_data + 1);
  local_74 = (undefined4)uVar1;
  fStack_50 = (float)((ulong)uVar1 >> 0x20);
  local_70 = (fStack_80 + fStack_50) * 0.5;
  fStack_4c = (pDVar2->coordMin).m_data[3];
  local_6c = (fStack_7c + fStack_4c) * 0.5;
  local_68 = (pDVar2->coordMax).m_data[0];
  local_60 = local_70;
  local_5c = local_6c;
  local_58 = local_68;
  uStack_54 = local_74;
  ShaderRenderCaseInstance::addAttribute
            (&this->super_ShaderRenderCaseInstance,0,VK_FORMAT_R32G32B32A32_SFLOAT,0x10,4,positions)
  ;
  if (this->m_definitions->coordDataType != TYPE_LAST) {
    ShaderRenderCaseInstance::addAttribute
              (&this->super_ShaderRenderCaseInstance,1,VK_FORMAT_R32G32B32A32_SFLOAT,0x10,4,
               &local_88);
  }
  return;
}

Assistant:

void TriangleDerivateCaseInstance::setupDefaultInputs (void)
{
	const int		numVertices			= 4;
	const float		positions[]			=
	{
		-1.0f, -1.0f, 0.0f, 1.0f,
		-1.0f,  1.0f, 0.0f, 1.0f,
		1.0f, -1.0f, 0.0f, 1.0f,
		1.0f,  1.0f, 0.0f, 1.0f
	};
	const float		coords[]			=
	{
		m_values.coordMin.x(), m_values.coordMin.y(), m_values.coordMin.z(),								m_values.coordMax.w(),
		m_values.coordMin.x(), m_values.coordMax.y(), (m_values.coordMin.z()+m_values.coordMax.z())*0.5f,	(m_values.coordMin.w()+m_values.coordMax.w())*0.5f,
		m_values.coordMax.x(), m_values.coordMin.y(), (m_values.coordMin.z()+m_values.coordMax.z())*0.5f,	(m_values.coordMin.w()+m_values.coordMax.w())*0.5f,
		m_values.coordMax.x(), m_values.coordMax.y(), m_values.coordMax.z(),								m_values.coordMin.w()
	};

	addAttribute(0u, vk::VK_FORMAT_R32G32B32A32_SFLOAT, 4 * (deUint32)sizeof(float), numVertices, positions);
	if (m_definitions.coordDataType != glu::TYPE_LAST)
		addAttribute(1u, vk::VK_FORMAT_R32G32B32A32_SFLOAT, 4 * (deUint32)sizeof(float), numVertices, coords);
}